

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_3bit_ea(m68k_info *info,int opcode,int size)

{
  cs_m68k *op;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  op = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),
                     (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  op->operands[0].type = M68K_OP_IMM;
  op->operands[0].address_mode = M68K_AM_IMMEDIATE;
  aVar1.reg_pair.reg_1 = 0;
  aVar1.simm = (float)g_3bit_qdata_table[*(uint *)(in_RDI + 0x24) >> 9 & 7];
  op->operands[0].field_0 = aVar1;
  get_ea_mode_op((m68k_info *)CONCAT44(in_ESI,in_EDX),op->operands,
                 (uint)((ulong)(op->operands + 1) >> 0x20),(uint)(op->operands + 1));
  return;
}

Assistant:

static void build_3bit_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = g_3bit_qdata_table[(info->ir >> 9) & 7];

	get_ea_mode_op(info, op1, info->ir, size);
}